

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::qdxt_pack_init
          (mipmapped_texture *this,qdxt_state *state,mipmapped_texture *dst_tex,
          qdxt1_params *dxt1_params,qdxt5_params *dxt5_params,pixel_format fmt,bool cook)

{
  qdxt5_params *__dest;
  pixel_format pVar1;
  mip_level *this_00;
  dxt_pixel_block *pdVar2;
  bool bVar3;
  undefined4 uVar4;
  uint uVar5;
  conversion_type cVar6;
  int iVar7;
  image_u8 *other;
  color_quad_u8 *pcVar8;
  bool bVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  color_quad_u8 *pcVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  conversion_type local_114;
  bool *local_f0;
  bool *local_e8;
  image_u8 img;
  image_u8 tmp_img;
  
  if ((this->m_faces).m_size == 0) {
    return false;
  }
  memcpy(&state->m_qdxt1_params,dxt1_params,0x630);
  __dest = state->m_qdxt5_params;
  memcpy(__dest,dxt5_params,0x62d);
  memcpy(state->m_qdxt5_params + 1,dxt5_params,0x62d);
  state->m_has_blocks[0] = false;
  state->m_has_blocks[1] = false;
  state->m_has_blocks[2] = false;
  if ((int)fmt < 0x41325445) {
    if (0x32495440 < (int)fmt) {
      if ((int)fmt < 0x35545844) {
        if (fmt == PIXEL_FMT_3DC) {
          state->m_has_blocks[1] = true;
          state->m_has_blocks[2] = true;
          state->m_qdxt5_params[0].m_comp_index = 1;
          uVar4 = 0;
LAB_00133122:
          iVar7 = 1;
          lVar11 = 0x5db8;
          goto LAB_00133127;
        }
        if (fmt != PIXEL_FMT_DXT4) {
          return false;
        }
      }
      else if (fmt != PIXEL_FMT_DXT5) {
        if (fmt != PIXEL_FMT_DXT1A) {
          return false;
        }
        state->m_has_blocks[0] = true;
        (state->m_qdxt1_params).m_use_alpha_blocks = true;
        goto LAB_0013308e;
      }
      state->m_has_blocks[0] = true;
      state->m_has_blocks[1] = true;
      (state->m_qdxt1_params).m_use_alpha_blocks = false;
      goto LAB_00133056;
    }
    if (0x31545843 < (int)fmt) {
      if (fmt != PIXEL_FMT_DXT1) {
        if (fmt != PIXEL_FMT_ETC2) {
          return false;
        }
        goto LAB_00132fae;
      }
      state->m_has_blocks[0] = true;
LAB_0013308e:
      iVar7 = 0;
      goto LAB_00133090;
    }
    if (fmt == PIXEL_FMT_ETC1) {
LAB_00132fae:
      console::warning("mipmapped_texture::qdxt_pack_init: This method does not support ETCn");
      return false;
    }
    if (fmt != PIXEL_FMT_DXT5A) {
      return false;
    }
    state->m_has_blocks[1] = true;
    uVar4 = 3;
    lVar11 = 0x5788;
    iVar7 = 0;
LAB_00133127:
    *(undefined4 *)((long)((state->m_qdxt1).m_params.m_mip_desc + -7) + lVar11) = uVar4;
    uVar10 = dxt1_params->m_progress_start;
    state->m_qdxt5_params[0].m_progress_start = uVar10;
    uVar5 = dxt1_params->m_progress_range / (iVar7 + 1U);
    state->m_qdxt5_params[0].m_progress_range = uVar5;
    if ((char)iVar7 != '\0') {
      uVar10 = uVar5 + uVar10;
      state->m_qdxt5_params[1].m_progress_start = uVar10;
      uVar5 = dxt1_params->m_progress_range - uVar10;
      lVar11 = 0x5db4;
      goto LAB_00133190;
    }
  }
  else {
    if ((int)fmt < 0x53315445) {
      if ((int)fmt < 0x52424778) {
        if (fmt == PIXEL_FMT_ETC2A) goto LAB_00132fae;
        if (fmt != PIXEL_FMT_DXT5_AGBR) {
          return false;
        }
      }
      else if ((fmt != PIXEL_FMT_DXT5_xGBR) && (fmt != PIXEL_FMT_DXT5_xGxR)) {
        return false;
      }
    }
    else {
      if ((int)fmt < 0x59583241) {
        if ((fmt != PIXEL_FMT_ETC1S) && (fmt != PIXEL_FMT_ETC2AS)) {
          return false;
        }
        goto LAB_00132fae;
      }
      if (fmt == PIXEL_FMT_DXN) {
        state->m_has_blocks[1] = true;
        state->m_has_blocks[2] = true;
        state->m_qdxt5_params[0].m_comp_index = 0;
        uVar4 = 1;
        goto LAB_00133122;
      }
      if (fmt != PIXEL_FMT_DXT5_CCxY) {
        return false;
      }
    }
    state->m_has_blocks[0] = true;
    state->m_has_blocks[1] = true;
    (state->m_qdxt1_params).m_perceptual = false;
    (state->m_qdxt1_params).m_use_alpha_blocks = false;
LAB_00133056:
    state->m_qdxt5_params[0].m_comp_index = 3;
    iVar7 = 1;
LAB_00133090:
    uVar10 = dxt1_params->m_progress_start;
    (state->m_qdxt1_params).m_progress_start = uVar10;
    uVar5 = dxt1_params->m_progress_range / (iVar7 + 1U);
    (state->m_qdxt1_params).m_progress_range = uVar5;
    if ((char)iVar7 != '\0') {
      state->m_qdxt5_params[0].m_progress_start = uVar5 + uVar10;
      uVar5 = dxt1_params->m_progress_range / (iVar7 + 1U);
      lVar11 = 0x5784;
LAB_00133190:
      *(uint *)((long)((state->m_qdxt1).m_params.m_mip_desc + -7) + lVar11) = uVar5;
    }
  }
  local_e8 = state->m_has_blocks + 1;
  local_f0 = state->m_has_blocks + 2;
  state->m_fmt = fmt;
  init(dst_tex,(EVP_PKEY_CTX *)(ulong)this->m_width);
  if ((state->m_pixel_blocks).m_size != 0) {
    (state->m_pixel_blocks).m_size = 0;
  }
  local_114 = cConversion_Invalid;
  if (!cook) goto LAB_001332cd;
  cVar6 = image_utils::get_conversion_type(true,fmt);
  if ((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_DXT5A)) {
    pVar1 = this->m_format;
    local_114 = cConversion_Y_To_A;
    if ((int)pVar1 < 0x41325445) {
      if ((int)pVar1 < 0x34545844) {
        if (((pVar1 != PIXEL_FMT_DXT5A) && (pVar1 != PIXEL_FMT_DXT2)) && (pVar1 != PIXEL_FMT_DXT3))
        goto LAB_001332cd;
      }
      else if (((pVar1 != PIXEL_FMT_DXT4) && (pVar1 != PIXEL_FMT_DXT5)) &&
              (pVar1 != PIXEL_FMT_DXT1A)) goto LAB_001332cd;
    }
    else if ((int)pVar1 < 0x41787878) {
      if (((pVar1 != PIXEL_FMT_ETC2A) && (pVar1 != PIXEL_FMT_A8R8G8B8)) && (pVar1 != PIXEL_FMT_A8L8)
         ) goto LAB_001332cd;
    }
    else if (((pVar1 != PIXEL_FMT_A8) && (pVar1 != PIXEL_FMT_ETC2AS)) &&
            (pVar1 != PIXEL_FMT_DXT5_AGBR)) goto LAB_001332cd;
  }
  local_114 = cVar6;
LAB_001332cd:
  (state->m_qdxt1_params).m_num_mips = 0;
  state->m_qdxt5_params[0].m_num_mips = 0;
  state->m_qdxt5_params[1].m_num_mips = 0;
  uVar5 = (this->m_faces).m_size;
  if (uVar5 != 0) {
    uVar13 = 0;
    do {
      uVar16 = 0;
      uVar14 = 1;
      while( true ) {
        if (uVar14 == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)((this->m_faces).m_p)->m_size;
        }
        if (uVar12 <= uVar16) break;
        this_00 = (this->m_faces).m_p[uVar13].m_p[uVar16];
        (dst_tex->m_faces).m_p[uVar13].m_p[uVar16]->m_orient_flags = this_00->m_orient_flags;
        tmp_img.m_width = 0;
        tmp_img.m_height = 0;
        tmp_img.m_pitch = 0;
        tmp_img.m_total = 0;
        tmp_img.m_comp_flags = 0xf;
        tmp_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
        tmp_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
        tmp_img.m_pixel_buf.m_size = 0;
        tmp_img.m_pixel_buf.m_capacity = 0;
        other = mip_level::get_unpacked_image(this_00,&tmp_img,1);
        image<crnlib::color_quad<unsigned_char,_int>_>::image(&img,other);
        if (local_114 != cConversion_Invalid) {
          image_utils::convert_image(&img,local_114);
        }
        uVar14 = img.m_width + 3;
        uVar15 = uVar14 >> 2;
        uVar18 = img.m_height + 3;
        uVar22 = uVar18 >> 2;
        iVar7 = uVar22 * uVar15;
        uVar5 = (state->m_pixel_blocks).m_size;
        if (iVar7 != 0) {
          uVar23 = iVar7 + uVar5;
          if ((uVar5 <= uVar23) && ((state->m_pixel_blocks).m_capacity < uVar23)) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&state->m_pixel_blocks,uVar23,iVar7 == 1,0x40,
                       (object_mover)0x0,false);
          }
          (state->m_pixel_blocks).m_size = uVar23;
        }
        pdVar2 = (state->m_pixel_blocks).m_p;
        uVar23 = (state->m_qdxt1_params).m_num_mips;
        (state->m_qdxt1_params).m_mip_desc[uVar23].m_first_block = uVar5;
        (state->m_qdxt1_params).m_mip_desc[uVar23].m_block_width = uVar15;
        (state->m_qdxt1_params).m_mip_desc[uVar23].m_block_height = uVar22;
        (state->m_qdxt1_params).m_num_mips = uVar23 + 1;
        lVar11 = 0;
        bVar3 = true;
        do {
          bVar9 = bVar3;
          uVar23 = state->m_qdxt5_params[lVar11].m_num_mips;
          __dest[lVar11].m_mip_desc[uVar23].m_first_block = uVar5;
          __dest[lVar11].m_mip_desc[uVar23].m_block_width = uVar15;
          __dest[lVar11].m_mip_desc[uVar23].m_block_height = uVar22;
          state->m_qdxt5_params[lVar11].m_num_mips = uVar23 + 1;
          lVar11 = 1;
          bVar3 = false;
        } while (bVar9);
        if (3 < uVar18) {
          pcVar8 = (color_quad_u8 *)(pdVar2 + uVar5);
          uVar5 = 0;
          do {
            if (3 < uVar14) {
              iVar7 = 0;
              uVar18 = 0;
              do {
                uVar23 = 0;
                pcVar20 = pcVar8;
                do {
                  uVar19 = uVar23 | uVar5 * 4;
                  iVar21 = 0;
                  do {
                    iVar24 = img.m_width - 1;
                    if (iVar7 + iVar21 < (int)(img.m_width - 1)) {
                      iVar24 = iVar7 + iVar21;
                    }
                    if ((int)(uVar18 * 4) < 0) {
                      iVar24 = 0;
                    }
                    uVar17 = img.m_height - 1;
                    if ((int)uVar19 < (int)(img.m_height - 1)) {
                      uVar17 = uVar19;
                    }
                    if ((int)(uVar5 * 4) < 0) {
                      uVar17 = 0;
                    }
                    uVar17 = uVar17 * img.m_pitch + iVar24;
                    (((color_quad_u8 *)&(pcVar20->field_0).field_0.r)->field_0).field_0.r =
                         img.m_pPixels[uVar17].field_0.field_0.r;
                    (pcVar20->field_0).field_0.g = img.m_pPixels[uVar17].field_0.field_0.g;
                    (pcVar20->field_0).field_0.b = img.m_pPixels[uVar17].field_0.field_0.b;
                    (pcVar20->field_0).field_0.a = img.m_pPixels[uVar17].field_0.field_0.a;
                    pcVar20 = pcVar20 + 1;
                    iVar21 = iVar21 + 1;
                  } while (iVar21 != 4);
                  uVar23 = uVar23 + 1;
                } while (uVar23 != 4);
                pcVar8 = pcVar8 + 0x10;
                uVar18 = uVar18 + 1;
                iVar7 = iVar7 + 4;
              } while (uVar18 != uVar15);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar22);
        }
        if (img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(img.m_pixel_buf.m_p);
        }
        if (tmp_img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(tmp_img.m_pixel_buf.m_p);
        }
        uVar16 = uVar16 + 1;
        uVar5 = (this->m_faces).m_size;
        uVar14 = uVar5;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar5);
  }
  if ((((state->m_has_blocks[0] == false) ||
       (iVar7 = qdxt1::init(&state->m_qdxt1,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
       (char)iVar7 != '\0')) &&
      ((*local_e8 != true ||
       (iVar7 = qdxt5::init(&state->m_qdxt5a,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
       (char)iVar7 != '\0')))) &&
     ((*local_f0 != true ||
      (iVar7 = qdxt5::init(&state->m_qdxt5b,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
      (char)iVar7 != '\0')))) {
    return true;
  }
  return false;
}

Assistant:

bool mipmapped_texture::qdxt_pack_init(qdxt_state& state, mipmapped_texture& dst_tex, const qdxt1_params& dxt1_params, const qdxt5_params& dxt5_params, pixel_format fmt, bool cook) {
  if (!is_valid())
    return false;

  state.m_qdxt1_params = dxt1_params;
  state.m_qdxt5_params[0] = dxt5_params;
  state.m_qdxt5_params[1] = dxt5_params;
  utils::zero_object(state.m_has_blocks);

  switch (fmt) {
    case PIXEL_FMT_DXT1: {
      state.m_has_blocks[0] = true;
      break;
    }
    case PIXEL_FMT_DXT1A: {
      state.m_has_blocks[0] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = true;
      break;
    }
    case PIXEL_FMT_DXT4:
    case PIXEL_FMT_DXT5: {
      state.m_has_blocks[0] = true;
      state.m_has_blocks[1] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = false;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_DXT5_CCxY:
    case PIXEL_FMT_DXT5_xGxR:
    case PIXEL_FMT_DXT5_xGBR:
    case PIXEL_FMT_DXT5_AGBR: {
      state.m_has_blocks[0] = true;
      state.m_has_blocks[1] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = false;
      state.m_qdxt1_params.m_perceptual = false;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_3DC: {
      state.m_has_blocks[1] = true;
      state.m_has_blocks[2] = true;
      state.m_qdxt5_params[0].m_comp_index = 1;
      state.m_qdxt5_params[1].m_comp_index = 0;
      break;
    }
    case PIXEL_FMT_DXN: {
      state.m_has_blocks[1] = true;
      state.m_has_blocks[2] = true;
      state.m_qdxt5_params[0].m_comp_index = 0;
      state.m_qdxt5_params[1].m_comp_index = 1;
      break;
    }
    case PIXEL_FMT_DXT5A: {
      state.m_has_blocks[1] = true;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_ETC1:
    case PIXEL_FMT_ETC2:
    case PIXEL_FMT_ETC2A:
    case PIXEL_FMT_ETC1S:
    case PIXEL_FMT_ETC2AS: {
      console::warning("mipmapped_texture::qdxt_pack_init: This method does not support ETCn");
      return false;
    }
    default: {
      CRNLIB_ASSERT(0);
      return false;
    }
  }

  const uint num_elements = state.m_has_blocks[0] + state.m_has_blocks[1] + state.m_has_blocks[2];

  uint cur_progress_start = dxt1_params.m_progress_start;
  if (state.m_has_blocks[0]) {
    state.m_qdxt1_params.m_progress_start = cur_progress_start;
    state.m_qdxt1_params.m_progress_range = dxt1_params.m_progress_range / num_elements;
    cur_progress_start += state.m_qdxt1_params.m_progress_range;
  }

  if (state.m_has_blocks[1]) {
    state.m_qdxt5_params[0].m_progress_start = cur_progress_start;
    state.m_qdxt5_params[0].m_progress_range = dxt1_params.m_progress_range / num_elements;
    cur_progress_start += state.m_qdxt5_params[0].m_progress_range;
  }

  if (state.m_has_blocks[2]) {
    state.m_qdxt5_params[1].m_progress_start = cur_progress_start;
    state.m_qdxt5_params[1].m_progress_range = dxt1_params.m_progress_range - cur_progress_start;
  }

  state.m_fmt = fmt;

  dst_tex.init(get_width(), get_height(), get_num_levels(), get_num_faces(), fmt, get_name().get_ptr(), cDefaultOrientationFlags);

  state.m_pixel_blocks.resize(0);

  image_utils::conversion_type cook_conv_type = image_utils::cConversion_Invalid;
  if (cook) {
    cook_conv_type = image_utils::get_conversion_type(true, fmt);
    if (pixel_format_helpers::is_alpha_only(fmt) && !pixel_format_helpers::has_alpha(m_format))
      cook_conv_type = image_utils::cConversion_Y_To_A;
  }

  state.m_qdxt1_params.m_num_mips = 0;
  state.m_qdxt5_params[0].m_num_mips = 0;
  state.m_qdxt5_params[1].m_num_mips = 0;

  for (uint f = 0; f < get_num_faces(); f++) {
    for (uint l = 0; l < get_num_levels(); l++) {
      mip_level* pLevel = get_level(f, l);

      dst_tex.get_level(f, l)->set_orientation_flags(pLevel->get_orientation_flags());

      image_u8 tmp_img;
      image_u8 img(*pLevel->get_unpacked_image(tmp_img, cUnpackFlagUncook));

      if (cook_conv_type != image_utils::cConversion_Invalid)
        image_utils::convert_image(img, cook_conv_type);

      const uint num_blocks_x = (img.get_width() + 3) / 4;
      const uint num_blocks_y = (img.get_height() + 3) / 4;
      const uint total_blocks = num_blocks_x * num_blocks_y;

      const uint cur_size = state.m_pixel_blocks.size();
      state.m_pixel_blocks.resize(cur_size + total_blocks);
      dxt_pixel_block* pDst_blocks = &state.m_pixel_blocks[cur_size];

      {
        CRNLIB_ASSERT(state.m_qdxt1_params.m_num_mips < qdxt1_params::cMaxMips);
        qdxt1_params::mip_desc& mip_desc = state.m_qdxt1_params.m_mip_desc[state.m_qdxt1_params.m_num_mips];
        mip_desc.m_first_block = cur_size;
        mip_desc.m_block_width = num_blocks_x;
        mip_desc.m_block_height = num_blocks_y;
        state.m_qdxt1_params.m_num_mips++;
      }

      for (uint i = 0; i < 2; i++) {
        CRNLIB_ASSERT(state.m_qdxt5_params[i].m_num_mips < qdxt5_params::cMaxMips);
        qdxt5_params::mip_desc& mip_desc = state.m_qdxt5_params[i].m_mip_desc[state.m_qdxt5_params[i].m_num_mips];
        mip_desc.m_first_block = cur_size;
        mip_desc.m_block_width = num_blocks_x;
        mip_desc.m_block_height = num_blocks_y;
        state.m_qdxt5_params[i].m_num_mips++;
      }

      for (uint block_y = 0; block_y < num_blocks_y; block_y++) {
        const uint img_y = block_y << 2;

        for (uint block_x = 0; block_x < num_blocks_x; block_x++) {
          const uint img_x = block_x << 2;

          color_quad_u8* pDst_pixel = &pDst_blocks->m_pixels[0][0];

          pDst_blocks++;

          for (uint by = 0; by < 4; by++)
            for (uint bx = 0; bx < 4; bx++)
              *pDst_pixel++ = img.get_clamped(img_x + bx, img_y + by);
        }  // block_x
      }    // block_y
    }      // l
  }        // f

  if (state.m_has_blocks[0]) {
    if (!state.m_qdxt1.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt1_params))
      return false;
  }

  if (state.m_has_blocks[1]) {
    if (!state.m_qdxt5a.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt5_params[0]))
      return false;
  }

  if (state.m_has_blocks[2]) {
    if (!state.m_qdxt5b.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt5_params[1]))
      return false;
  }

  return true;
}